

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall
ON_3dPointArray::GetClosestPoint
          (ON_3dPointArray *this,ON_3dPoint P,int *closest_point_index,double maximum_distance)

{
  double dVar1;
  bool local_25;
  int local_24;
  bool rc;
  double dStack_20;
  int i;
  double maximum_distance_local;
  int *closest_point_index_local;
  ON_3dPointArray *this_local;
  
  dStack_20 = maximum_distance;
  maximum_distance_local = (double)closest_point_index;
  closest_point_index_local = (int *)this;
  local_25 = ON_GetClosestPointInPointList
                       ((this->super_ON_SimpleArray<ON_3dPoint>).m_count,
                        (this->super_ON_SimpleArray<ON_3dPoint>).m_a,P,&local_24);
  if (local_25) {
    if ((dStack_20 <= 0.0) ||
       (dVar1 = ON_3dPoint::DistanceTo(&P,(this->super_ON_SimpleArray<ON_3dPoint>).m_a + local_24),
       dVar1 <= dStack_20)) {
      if (maximum_distance_local != 0.0) {
        *(int *)maximum_distance_local = local_24;
      }
    }
    else {
      local_25 = false;
    }
  }
  return local_25;
}

Assistant:

bool ON_3dPointArray::GetClosestPoint( 
          ON_3dPoint P,
          int* closest_point_index,
          double maximum_distance
          ) const
{
  int i;

  bool rc = ON_GetClosestPointInPointList( m_count, m_a , P, &i );

  if (rc)
  {
    if ( maximum_distance > 0.0 && P.DistanceTo(m_a[i]) > maximum_distance )
    {
      rc = false;
    }
    else if ( closest_point_index )
    {
      *closest_point_index = i;
    }
  }

  return rc;
}